

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

int listincludes(char *list,char *needle,int needlelen)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *end;
  char *start;
  char *s;
  
  iVar3 = 0;
  s = list;
  while( true ) {
    bVar1 = parselist(&s,&start,&end,&listquotestart,&listquoteend);
    if (!bVar1) {
      return -1;
    }
    iVar2 = (int)end - (int)start;
    if ((iVar2 == needlelen) && (iVar2 = strncmp(needle,start,(long)iVar2), iVar2 == 0)) break;
    iVar3 = iVar3 + 1;
  }
  return iVar3;
}

Assistant:

int listincludes(const char *list, const char *needle, int needlelen)
{
    int offset = 0;
    for(const char *s = list, *start, *end; parselist(s, start, end);)
    {
        int len = end - start;
        if(needlelen == len && !strncmp(needle, start, len)) return offset;
        offset++;
    }
    return -1;
}